

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O2

string * __thiscall despot::TagState::text_abi_cxx11_(string *__return_storage_ptr__,TagState *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if (BaseTag::current_ == 0) {
    to_string<int>(__return_storage_ptr__,*(int *)&this->field_0xc);
  }
  else {
    despot::Floor::NumCells();
    despot::Floor::GetCell((int)BaseTag::current_ + 0x58);
    despot::Floor::NumCells();
    despot::Floor::GetCell((int)BaseTag::current_ + 0x58);
    to_string<despot::Coord>((Coord)0xa3);
    std::operator+(&local_88,"Rob at ",&local_48);
    std::operator+(&local_68,&local_88,", Opp at ");
    to_string<despot::Coord>((Coord)0xd8);
    std::operator+(__return_storage_ptr__,&local_68,&bStack_a8);
    std::__cxx11::string::~string((string *)&bStack_a8);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

string TagState::text() const {
	// NOTE: This will fail if several Tag instances are running
	if (BaseTag::current_ != NULL) {
		int rob = BaseTag::current_->StateIndexToRobIndex(state_id);
		Coord rob_pos = BaseTag::current_->floor_.GetCell(rob);
		int opp = BaseTag::current_->StateIndexToOppIndex(state_id);
		Coord opp_pos = BaseTag::current_->floor_.GetCell(opp);
		return "Rob at " + to_string(rob_pos) + ", Opp at " + to_string(opp_pos);
	} else
		return to_string(state_id);
}